

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O1

bool __thiscall gimage::PNMImageIO::handlesFile(PNMImageIO *this,char *name,bool reading)

{
  long lVar1;
  bool bVar2;
  string s;
  allocator local_31;
  undefined1 *local_30;
  ulong local_28;
  undefined1 local_20 [16];
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  if (local_28 < 5) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x150ad1,0xffffffffffffffff);
    bVar2 = true;
    if (lVar1 != local_28 - 4) {
      lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x150a0c,0xffffffffffffffff);
      if (lVar1 != local_28 - 4) {
        lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x15098f,0xffffffffffffffff);
        if (lVar1 != local_28 - 4) {
          lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x150a11,0xffffffffffffffff);
          if (lVar1 != local_28 - 4) {
            lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x150a16,0xffffffffffffffff);
            if (lVar1 != local_28 - 4) {
              lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x150a1b,0xffffffffffffffff);
              bVar2 = lVar1 == local_28 - 4;
            }
          }
        }
      }
    }
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return bVar2;
}

Assistant:

bool PNMImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.rfind(".pgm") == s.size()-4 || s.rfind(".PGM") == s.size()-4 ||
      s.rfind(".ppm") == s.size()-4 || s.rfind(".PPM") == s.size()-4 ||
      s.rfind(".pfm") == s.size()-4 || s.rfind(".PFM") == s.size()-4)
  {
    return true;
  }

  return false;
}